

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O1

void av1_setup_pred_block
               (MACROBLOCKD *xd,buf_2d *dst,YV12_BUFFER_CONFIG *src,scale_factors *scale,
               scale_factors *scale_uv,int num_planes)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  MB_MODE_INFO **ppMVar5;
  MB_MODE_INFO *pMVar6;
  uint8_t *puVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  scale_factors *psVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  
  dst->buf = (src->field_5).field_0.y_buffer;
  dst->stride = (src->field_4).field_0.y_stride;
  dst[1].buf = (src->field_5).field_0.u_buffer;
  dst[2].buf = (src->field_5).field_0.v_buffer;
  iVar14 = (src->field_4).field_0.uv_stride;
  dst[2].stride = iVar14;
  dst[1].stride = iVar14;
  if (0 < num_planes) {
    uVar1 = xd->mi_row;
    uVar2 = xd->mi_col;
    ppMVar5 = xd->mi;
    lVar15 = 0;
    do {
      pMVar6 = *ppMVar5;
      psVar11 = scale_uv;
      if (lVar15 == 0) {
        psVar11 = scale;
      }
      iVar14 = *(int *)((long)xd->plane[0].pre + lVar15 + -0x28);
      uVar8._0_1_ = pMVar6->bsize;
      uVar8._1_1_ = pMVar6->partition;
      uVar8._2_1_ = pMVar6->mode;
      uVar8._3_1_ = pMVar6->uv_mode;
      uVar13 = (uint)((0x20005UL >> ((ulong)uVar8 & 0x3f) & 1) != 0);
      if (iVar14 == 0) {
        uVar13 = 0;
      }
      iVar9 = *(int *)((long)xd->plane[0].pre + lVar15 + -0x2c);
      uVar8 = (uint)((0x10003UL >> ((ulong)uVar8 & 0x3f) & 1) != 0);
      if (iVar9 == 0) {
        uVar8 = 0;
      }
      iVar9 = (int)((~uVar8 & uVar2) << 2) >> ((byte)iVar9 & 0x1f);
      iVar14 = (int)((~uVar13 & uVar1) << 2) >> ((byte)iVar14 & 0x1f);
      if (psVar11 != (scale_factors *)0x0) {
        iVar3 = psVar11->x_scale_fp;
        if ((long)iVar3 != -1) {
          iVar4 = psVar11->y_scale_fp;
          if (((long)iVar4 != -1) && (iVar4 != 0x4000 || iVar3 != 0x4000)) {
            lVar12 = (long)(iVar3 * 8 + -0x20000) + (long)iVar9 * (long)iVar3;
            if (lVar12 < 0) {
              iVar9 = -(int)((ulong)(0x80 - lVar12) >> 8);
            }
            else {
              iVar9 = (int)((ulong)(lVar12 + 0x80) >> 8);
            }
            lVar12 = (long)(iVar4 * 8 + -0x20000) + (long)iVar14 * (long)iVar4;
            if (lVar12 < 0) {
              iVar14 = -(int)((ulong)(0x80 - lVar12) >> 8);
            }
            else {
              iVar14 = (int)((ulong)(lVar12 + 0x80) >> 8);
            }
            iVar9 = iVar9 >> 6;
            iVar14 = iVar14 >> 6;
          }
        }
      }
      puVar7 = dst->buf;
      uVar10 = (ulong)(lVar15 != 0);
      iVar3 = *(int *)((long)src->store_buf_adr + uVar10 * 4 + -0x38);
      iVar4 = *(int *)((long)src->store_buf_adr + uVar10 * 4 + -0x30);
      dst->buf = puVar7 + (long)iVar14 * (long)dst->stride + (long)iVar9;
      dst->buf0 = puVar7;
      dst->width = iVar3;
      dst->height = iVar4;
      lVar15 = lVar15 + 0xa30;
      dst = dst + 1;
    } while ((ulong)(uint)num_planes * 0xa30 != lVar15);
  }
  return;
}

Assistant:

void av1_setup_pred_block(const MACROBLOCKD *xd,
                          struct buf_2d dst[MAX_MB_PLANE],
                          const YV12_BUFFER_CONFIG *src,
                          const struct scale_factors *scale,
                          const struct scale_factors *scale_uv,
                          const int num_planes) {
  dst[0].buf = src->y_buffer;
  dst[0].stride = src->y_stride;
  dst[1].buf = src->u_buffer;
  dst[2].buf = src->v_buffer;
  dst[1].stride = dst[2].stride = src->uv_stride;

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  for (int i = 0; i < num_planes; ++i) {
    setup_pred_plane(dst + i, xd->mi[0]->bsize, dst[i].buf,
                     i ? src->uv_crop_width : src->y_crop_width,
                     i ? src->uv_crop_height : src->y_crop_height,
                     dst[i].stride, mi_row, mi_col, i ? scale_uv : scale,
                     xd->plane[i].subsampling_x, xd->plane[i].subsampling_y);
  }
}